

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

bool __thiscall despot::util::tinyxml::TiXmlText::Blank(TiXmlText *this)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  TiXmlString *this_00;
  ulong index;
  
  this_00 = &(this->super_TiXmlNode).value;
  uVar4 = 0;
  do {
    index = (ulong)uVar4;
    uVar1 = this_00->rep_->size;
    if (uVar1 <= index) break;
    pcVar3 = TiXmlString::operator[](this_00,index);
    bVar2 = TiXmlBase::IsWhiteSpace(*pcVar3);
    uVar4 = uVar4 + 1;
  } while (bVar2);
  return uVar1 <= index;
}

Assistant:

bool TiXmlText::Blank() const {
	for (unsigned i = 0; i < value.length(); i++)
		if (!IsWhiteSpace(value[i]))
			return false;
	return true;
}